

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O3

void __thiscall pmt_tests::pmt_test1::test_method(pmt_test1 *this)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  ulong __n;
  uint64_t uVar8;
  uchar *puVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint256 *__args;
  uint j;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint32_t uVar16;
  ulong uVar17;
  pointer puVar18;
  FastRandomContext *this_00;
  ulong uVar19;
  iterator in_R8;
  iterator pvVar20;
  iterator in_R9;
  iterator pvVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid2;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid1;
  vector<uint256,_std::allocator<uint256>_> vTxid;
  uint256 merkleRoot3;
  uint256 merkleRoot2;
  CMutableTransaction tx;
  uint256 merkleRoot1;
  check_type cVar28;
  uint local_444;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 local_400 [16];
  undefined1 *local_3f0;
  char **local_3e8;
  assertion_result local_3e0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 local_3a8 [16];
  pointer local_398;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 local_2f8 [16];
  pointer local_2e8;
  undefined1 local_2d8 [16];
  pointer local_2c8;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 local_288 [24];
  long lStack_270;
  undefined1 local_268 [16];
  uint256 *local_258;
  vector<uint256,_std::allocator<uint256>_> local_250;
  undefined1 local_238 [16];
  shared_count sStack_228;
  _Bit_type *local_220;
  _Bit_pointer local_210;
  vector<uint256,_std::allocator<uint256>_> local_208;
  bool local_1f0;
  FastRandomContext *local_1e8;
  CPartialMerkleTree local_1e0;
  vector<bool,_std::allocator<bool>_> local_190;
  undefined1 local_168 [16];
  shared_count asStack_158 [2];
  undefined1 local_148 [9];
  uchar uStack_13f;
  uchar uStack_13e;
  uchar uStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  uchar uStack_139;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  uchar uStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  uchar uStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  uchar uStack_129;
  undefined1 local_128 [8];
  undefined1 auStack_120 [8];
  undefined1 local_118 [8];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_110;
  vector<uint256,_std::allocator<uint256>_> local_f8;
  bool local_e0;
  FastRandomContext *local_d8;
  uint256 local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  lVar10 = 0;
  do {
    uVar1 = test_method::tx_counts[lVar10];
    __n = (ulong)uVar1;
    local_58._16_11_ = SUB1611((undefined1  [16])0x0,5);
    local_58._0_8_ = (pointer)0x0;
    local_58._8_3_ = 0;
    local_58._11_5_ = 0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    uVar16 = 0;
    do {
      CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_128);
      local_238._0_8_ = (element_type *)0x0;
      local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ = uVar16;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8),
                 (CTransaction **)local_238,(allocator<CTransaction> *)&local_1e0,
                 (CMutableTransaction *)local_128);
      std::
      vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
      ::emplace_back<std::shared_ptr<CTransaction_const>>
                ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                  *)local_58,(shared_ptr<const_CTransaction> *)local_238);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_118 + 8));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_128);
      uVar16 = uVar16 + 1;
    } while (uVar1 + (uVar1 == 0) != uVar16);
    BlockMerkleRoot(&local_c8,(CBlock *)local_a8,(bool *)0x0);
    _local_118 = (undefined1  [16])0x0;
    _local_128 = (undefined1  [16])0x0;
    std::vector<uint256,_std::allocator<uint256>_>::vector
              (&local_250,__n,(value_type *)local_128,(allocator_type *)local_238);
    lVar12 = 0;
    do {
      lVar2 = *(long *)((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                               local_58._0_8_)->_M_ptr + lVar12);
      uVar3 = *(undefined8 *)(lVar2 + 0x39);
      uVar4 = *(undefined8 *)(lVar2 + 0x41);
      uVar5 = *(undefined8 *)(lVar2 + 0x51);
      puVar9 = ((local_250.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar12 * 2 + 0x10;
      *(undefined8 *)puVar9 = *(undefined8 *)(lVar2 + 0x49);
      *(undefined8 *)(puVar9 + 8) = uVar5;
      puVar9 = ((local_250.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar12 * 2;
      *(undefined8 *)puVar9 = uVar3;
      *(undefined8 *)(puVar9 + 8) = uVar4;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uVar1 + (uVar1 == 0)) << 4 != lVar12);
    local_444 = 1;
    iVar11 = 1;
    uVar15 = __n;
    if (lVar10 != 0) {
      do {
        uVar13 = (uint)uVar15;
        iVar11 = iVar11 + 1;
        uVar15 = (ulong)(uVar13 + 1 >> 1);
      } while (2 < uVar13);
    }
    do {
      auVar7[0xf] = 0;
      auVar7._0_15_ = stack0xfffffffffffffed9;
      _local_128 = auVar7 << 8;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_190,__n,(bool *)local_128,(allocator_type *)local_238);
      local_268 = (undefined1  [16])0x0;
      local_258 = (uint256 *)0x0;
      uVar15 = 0;
      do {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,local_444 >> 1);
        uVar17 = uVar15 >> 6 & 0x3ffffff;
        uVar19 = 1L << ((byte)uVar15 & 0x3f);
        if (uVar8 == 0) {
          local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar17] =
               local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar17] | uVar19;
          __args = local_250.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15;
          if ((uint256 *)local_268._8_8_ == local_258) {
            std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                      ((vector<uint256,std::allocator<uint256>> *)local_268,
                       (iterator)local_268._8_8_,__args);
          }
          else {
            uVar3 = *(undefined8 *)(__args->super_base_blob<256U>).m_data._M_elems;
            uVar4 = *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 8);
            uVar5 = *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 0x18);
            *(undefined8 *)((((base_blob<256U> *)local_268._8_8_)->m_data)._M_elems + 0x10) =
                 *(undefined8 *)((__args->super_base_blob<256U>).m_data._M_elems + 0x10);
            *(undefined8 *)((((base_blob<256U> *)local_268._8_8_)->m_data)._M_elems + 0x18) = uVar5;
            *(undefined8 *)(((base_blob<256U> *)local_268._8_8_)->m_data)._M_elems = uVar3;
            *(undefined8 *)((((base_blob<256U> *)local_268._8_8_)->m_data)._M_elems + 8) = uVar4;
            local_268._8_8_ = (uint256 *)(local_268._8_8_ + 0x20);
          }
        }
        else {
          local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar17] =
               local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar17] & ~uVar19;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar1 + (uVar1 == 0));
      CPartialMerkleTree::CPartialMerkleTree(&local_1e0,&local_250,&local_190);
      stack0xfffffffffffffd88 = (undefined1  [16])0x0;
      local_288._0_16_ = (undefined1  [16])0x0;
      CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree_const,ActionSerialize>
                (&local_1e0,local_288);
      uVar3 = local_268._0_8_;
      uVar4 = local_268._8_8_;
      local_298 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_290 = "";
      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x51;
      file.m_begin = (iterator)&local_298;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg)
      ;
      uVar13 = (int)((ulong)(uVar4 - uVar3) >> 5) * iVar11 + 1;
      if (uVar1 <= uVar13) {
        uVar13 = uVar1;
      }
      local_238[0] = (ulong)(local_288._8_8_ - (long)(local_288._0_8_ + lStack_270)) <=
                     (ulong)((uVar13 * 0x102 + 7 >> 3) + 10);
      local_238._8_8_ = (_Bit_type *)0x0;
      sStack_228.pi_._0_4_ = 0;
      sStack_228.pi_._4_4_ = 0;
      local_148._0_8_ = "ss.size() <= 10 + (258*n+7)/8";
      stack0xfffffffffffffec0 = "";
      auStack_120[0] = 0;
      local_128 = (undefined1  [8])&PTR__lazy_ostream_01389048;
      vStack_110.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)local_148;
      local_118 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_2b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_2b0 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_238,(lazy_ostream *)local_128,1,0,WARN,_cVar28,
                 (size_t)&local_2b8,0x51);
      boost::detail::shared_count::~shared_count((shared_count *)(local_238 + 0x10));
      CPartialMerkleTree::CPartialMerkleTree((CPartialMerkleTree *)local_128);
      local_d8 = this_00;
      CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree,ActionUnserialize>
                ((CPartialMerkleTree *)local_128,local_288);
      local_2d8 = (undefined1  [16])0x0;
      local_2c8 = (pointer)0x0;
      local_2e8 = (pointer)0x0;
      local_2f8 = (undefined1  [16])0x0;
      CPartialMerkleTree::ExtractMatches
                ((uint256 *)local_148,(CPartialMerkleTree *)local_128,
                 (vector<uint256,_std::allocator<uint256>_> *)local_2d8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
      local_308 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x5d;
      file_00.m_begin = (iterator)&local_308;
      msg_00.m_end = pvVar21;
      msg_00.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
                 msg_00);
      auVar25[0] = -(local_148[0] == local_c8.super_base_blob<256U>.m_data._M_elems[0]);
      auVar25[1] = -(local_148[1] == local_c8.super_base_blob<256U>.m_data._M_elems[1]);
      auVar25[2] = -(local_148[2] == local_c8.super_base_blob<256U>.m_data._M_elems[2]);
      auVar25[3] = -(local_148[3] == local_c8.super_base_blob<256U>.m_data._M_elems[3]);
      auVar25[4] = -(local_148[4] == local_c8.super_base_blob<256U>.m_data._M_elems[4]);
      auVar25[5] = -(local_148[5] == local_c8.super_base_blob<256U>.m_data._M_elems[5]);
      auVar25[6] = -(local_148[6] == local_c8.super_base_blob<256U>.m_data._M_elems[6]);
      auVar25[7] = -(local_148[7] == local_c8.super_base_blob<256U>.m_data._M_elems[7]);
      auVar25[8] = -(local_148[8] == local_c8.super_base_blob<256U>.m_data._M_elems[8]);
      auVar25[9] = -(uStack_13f == local_c8.super_base_blob<256U>.m_data._M_elems[9]);
      auVar25[10] = -(uStack_13e == local_c8.super_base_blob<256U>.m_data._M_elems[10]);
      auVar25[0xb] = -(uStack_13d == local_c8.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar25[0xc] = -(uStack_13c == local_c8.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar25[0xd] = -(uStack_13b == local_c8.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar25[0xe] = -(uStack_13a == local_c8.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar25[0xf] = -(uStack_139 == local_c8.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar22[0] = -(local_138 == local_c8.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar22[1] = -(uStack_137 == local_c8.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar22[2] = -(uStack_136 == local_c8.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar22[3] = -(uStack_135 == local_c8.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar22[4] = -(uStack_134 == local_c8.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar22[5] = -(uStack_133 == local_c8.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar22[6] = -(uStack_132 == local_c8.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar22[7] = -(uStack_131 == local_c8.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar22[8] = -(uStack_130 == local_c8.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar22[9] = -(uStack_12f == local_c8.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar22[10] = -(uStack_12e == local_c8.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar22[0xb] = -(uStack_12d == local_c8.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar22[0xc] = -(uStack_12c == local_c8.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar22[0xd] = -(uStack_12b == local_c8.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar22[0xe] = -(uStack_12a == local_c8.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar22[0xf] = -(uStack_129 == local_c8.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar22 = auVar22 & auVar25;
      local_168[0] = (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
      local_168[8] = '\0';
      local_168[9] = '\0';
      local_168[10] = '\0';
      local_168[0xb] = '\0';
      local_168[0xc] = '\0';
      local_168[0xd] = '\0';
      local_168[0xe] = '\0';
      local_168[0xf] = '\0';
      asStack_158[0].pi_ = (sp_counted_base *)0x0;
      local_400._0_8_ = "merkleRoot1 == merkleRoot2";
      local_400._8_8_ = "";
      local_238._8_8_ = local_238._9_8_ << 8;
      local_238._0_8_ = &PTR__lazy_ostream_01389048;
      sStack_228.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_220 = (_Bit_type *)local_400;
      local_328 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_320 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_168,(lazy_ostream *)local_238,1,0,WARN,_cVar28,
                 (size_t)&local_328,0x5d);
      boost::detail::shared_count::~shared_count(asStack_158);
      local_338 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_330 = "";
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x5e;
      file_01.m_begin = (iterator)&local_338;
      msg_01.m_end = pvVar21;
      msg_01.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_348,
                 msg_01);
      puVar9 = std::
               __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                         (local_148,local_128);
      local_168[0] = (class_property<bool>)(puVar9 != local_128);
      local_168[8] = '\0';
      local_168[9] = '\0';
      local_168[10] = '\0';
      local_168[0xb] = '\0';
      local_168[0xc] = '\0';
      local_168[0xd] = '\0';
      local_168[0xe] = '\0';
      local_168[0xf] = '\0';
      asStack_158[0].pi_ = (sp_counted_base *)0x0;
      local_400._0_8_ = "!merkleRoot2.IsNull()";
      local_400._8_8_ = "";
      local_238._8_8_ = local_238._9_8_ << 8;
      local_238._0_8_ = &PTR__lazy_ostream_01389048;
      sStack_228.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_220 = (_Bit_type *)local_400;
      local_358 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_350 = "";
      pvVar20 = (iterator)0x1;
      pvVar21 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_168,(lazy_ostream *)local_238,1,0,WARN,_cVar28,
                 (size_t)&local_358,0x5e);
      boost::detail::shared_count::~shared_count(asStack_158);
      local_368 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_360 = "";
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      local_370 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x61;
      file_02.m_begin = (iterator)&local_368;
      msg_02.m_end = pvVar21;
      msg_02.m_begin = pvVar20;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
                 msg_02);
      if (local_268._8_8_ - local_268._0_8_ == local_2d8._8_8_ - local_2d8._0_8_) {
        local_168[0] = (class_property<bool>)true;
        puVar18 = (pointer)local_2d8._0_8_;
        for (puVar9 = (uchar *)local_268._0_8_; puVar9 != (uchar *)local_268._8_8_;
            puVar9 = puVar9 + 0x20) {
          auVar26[0] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0] == *puVar9);
          auVar26[1] = -((puVar18->super_base_blob<256U>).m_data._M_elems[1] == puVar9[1]);
          auVar26[2] = -((puVar18->super_base_blob<256U>).m_data._M_elems[2] == puVar9[2]);
          auVar26[3] = -((puVar18->super_base_blob<256U>).m_data._M_elems[3] == puVar9[3]);
          auVar26[4] = -((puVar18->super_base_blob<256U>).m_data._M_elems[4] == puVar9[4]);
          auVar26[5] = -((puVar18->super_base_blob<256U>).m_data._M_elems[5] == puVar9[5]);
          auVar26[6] = -((puVar18->super_base_blob<256U>).m_data._M_elems[6] == puVar9[6]);
          auVar26[7] = -((puVar18->super_base_blob<256U>).m_data._M_elems[7] == puVar9[7]);
          auVar26[8] = -((puVar18->super_base_blob<256U>).m_data._M_elems[8] == puVar9[8]);
          auVar26[9] = -((puVar18->super_base_blob<256U>).m_data._M_elems[9] == puVar9[9]);
          auVar26[10] = -((puVar18->super_base_blob<256U>).m_data._M_elems[10] == puVar9[10]);
          auVar26[0xb] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0xb] == puVar9[0xb]);
          auVar26[0xc] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0xc] == puVar9[0xc]);
          auVar26[0xd] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0xd] == puVar9[0xd]);
          auVar26[0xe] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0xe] == puVar9[0xe]);
          auVar26[0xf] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0xf] == puVar9[0xf]);
          auVar23[0] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x10] == puVar9[0x10]);
          auVar23[1] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x11] == puVar9[0x11]);
          auVar23[2] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x12] == puVar9[0x12]);
          auVar23[3] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x13] == puVar9[0x13]);
          auVar23[4] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x14] == puVar9[0x14]);
          auVar23[5] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x15] == puVar9[0x15]);
          auVar23[6] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x16] == puVar9[0x16]);
          auVar23[7] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x17] == puVar9[0x17]);
          auVar23[8] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x18] == puVar9[0x18]);
          auVar23[9] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x19] == puVar9[0x19]);
          auVar23[10] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar9[0x1a]);
          auVar23[0xb] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar9[0x1b]);
          auVar23[0xc] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar9[0x1c]);
          auVar23[0xd] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar9[0x1d]);
          auVar23[0xe] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar9[0x1e]);
          auVar23[0xf] = -((puVar18->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar9[0x1f]);
          auVar23 = auVar23 & auVar26;
          if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0050e508;
          puVar18 = puVar18 + 1;
        }
      }
      else {
LAB_0050e508:
        local_168[0] = (class_property<bool>)false;
      }
      local_168[8] = '\0';
      local_168[9] = '\0';
      local_168[10] = '\0';
      local_168[0xb] = '\0';
      local_168[0xc] = '\0';
      local_168[0xd] = '\0';
      local_168[0xe] = '\0';
      local_168[0xf] = '\0';
      asStack_158[0].pi_ = (sp_counted_base *)0x0;
      local_400._0_8_ = "vMatchTxid1 == vMatchTxid2";
      local_400._8_8_ = "";
      local_238._8_8_ = local_238._9_8_ << 8;
      local_238._0_8_ = &PTR__lazy_ostream_01389048;
      sStack_228.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_220 = (_Bit_type *)local_400;
      local_388 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_380 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_168,(lazy_ostream *)local_238,1,0,WARN,_cVar28,
                 (size_t)&local_388,0x61);
      boost::detail::shared_count::~shared_count(asStack_158);
      iVar14 = 4;
      do {
        local_238._0_4_ = local_128._0_4_;
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)(local_238 + 8),
                   (vector<bool,_std::allocator<bool>_> *)auStack_120);
        std::vector<uint256,_std::allocator<uint256>_>::vector(&local_208,&local_f8);
        local_1f0 = local_e0;
        local_1e8 = local_d8;
        CPartialMerkleTreeTester::Damage((CPartialMerkleTreeTester *)local_238);
        local_3a8 = (undefined1  [16])0x0;
        local_398 = (pointer)0x0;
        CPartialMerkleTree::ExtractMatches
                  ((uint256 *)local_168,(CPartialMerkleTree *)local_238,
                   (vector<uint256,_std::allocator<uint256>_> *)local_3a8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
        local_3b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
        ;
        local_3b0 = "";
        local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x69;
        file_03.m_begin = (iterator)&local_3b8;
        msg_03.m_end = in_R9;
        msg_03.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c8
                   ,msg_03);
        auVar27[0] = -((class_property<bool>)local_c8.super_base_blob<256U>.m_data._M_elems[0] ==
                      local_168[0]);
        auVar27[1] = -(local_c8.super_base_blob<256U>.m_data._M_elems[1] == local_168[1]);
        auVar27[2] = -(local_c8.super_base_blob<256U>.m_data._M_elems[2] == local_168[2]);
        auVar27[3] = -(local_c8.super_base_blob<256U>.m_data._M_elems[3] == local_168[3]);
        auVar27[4] = -(local_c8.super_base_blob<256U>.m_data._M_elems[4] == local_168[4]);
        auVar27[5] = -(local_c8.super_base_blob<256U>.m_data._M_elems[5] == local_168[5]);
        auVar27[6] = -(local_c8.super_base_blob<256U>.m_data._M_elems[6] == local_168[6]);
        auVar27[7] = -(local_c8.super_base_blob<256U>.m_data._M_elems[7] == local_168[7]);
        auVar27[8] = -(local_c8.super_base_blob<256U>.m_data._M_elems[8] == local_168[8]);
        auVar27[9] = -(local_c8.super_base_blob<256U>.m_data._M_elems[9] == local_168[9]);
        auVar27[10] = -(local_c8.super_base_blob<256U>.m_data._M_elems[10] == local_168[10]);
        auVar27[0xb] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0xb] == local_168[0xb]);
        auVar27[0xc] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0xc] == local_168[0xc]);
        auVar27[0xd] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0xd] == local_168[0xd]);
        auVar27[0xe] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0xe] == local_168[0xe]);
        auVar27[0xf] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0xf] == local_168[0xf]);
        auVar24[0] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      (uchar)asStack_158[0].pi_);
        auVar24[1] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      (uchar)((ulong)asStack_158[0].pi_ >> 8));
        auVar24[2] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      (uchar)((ulong)asStack_158[0].pi_ >> 0x10));
        auVar24[3] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      (uchar)((ulong)asStack_158[0].pi_ >> 0x18));
        auVar24[4] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      (uchar)((ulong)asStack_158[0].pi_ >> 0x20));
        auVar24[5] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      (uchar)((ulong)asStack_158[0].pi_ >> 0x28));
        auVar24[6] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      (uchar)((ulong)asStack_158[0].pi_ >> 0x30));
        auVar24[7] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      (uchar)((ulong)asStack_158[0].pi_ >> 0x38));
        auVar24[8] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      (uchar)asStack_158[1].pi_);
        auVar24[9] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      (uchar)((ulong)asStack_158[1].pi_ >> 8));
        auVar24[10] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       (uchar)((ulong)asStack_158[1].pi_ >> 0x10));
        auVar24[0xb] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        (uchar)((ulong)asStack_158[1].pi_ >> 0x18));
        auVar24[0xc] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        (uchar)((ulong)asStack_158[1].pi_ >> 0x20));
        auVar24[0xd] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        (uchar)((ulong)asStack_158[1].pi_ >> 0x28));
        auVar24[0xe] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        (uchar)((ulong)asStack_158[1].pi_ >> 0x30));
        auVar24[0xf] = -(local_c8.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        (uchar)((ulong)asStack_158[1].pi_ >> 0x38));
        auVar24 = auVar24 & auVar27;
        local_3e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff);
        local_3e0.m_message.px = (element_type *)0x0;
        local_3e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_410 = "merkleRoot3 != merkleRoot1";
        local_408 = "";
        local_400._8_8_ = local_400._8_8_ & 0xffffffffffffff00;
        local_400._0_8_ = &PTR__lazy_ostream_01389048;
        local_3f0 = boost::unit_test::lazy_ostream::inst;
        local_3e8 = &local_410;
        local_420 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
        ;
        local_418 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_3e0,(lazy_ostream *)local_400,1,0,WARN,_cVar28,(size_t)&local_420,0x69);
        boost::detail::shared_count::~shared_count(&local_3e0.m_message.pn);
        if ((pointer)local_3a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_3a8._0_8_,(long)local_398 - local_3a8._0_8_);
        }
        if (local_208.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_208.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_208.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete((void *)local_238._8_8_,(long)local_210 - local_238._8_8_);
        }
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2f8._0_8_,(long)local_2e8 - local_2f8._0_8_);
      }
      if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2d8._0_8_,(long)local_2c8 - local_2d8._0_8_);
      }
      pvVar6 = (void *)CONCAT44(local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint32_t)
                                local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar6);
      }
      if (auStack_120 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_120,
                        (long)vStack_110.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage - (long)auStack_120);
        auStack_120 = (undefined1  [8])0x0;
      }
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_288);
      if (local_1e0.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e0.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e0.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1e0.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_1e0.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_1e0.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_1e0.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if ((void *)local_268._0_8_ != (void *)0x0) {
        operator_delete((void *)local_268._0_8_,(long)local_258 - local_268._0_8_);
      }
      if (local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
      }
      local_444 = local_444 + 1;
    } while (local_444 != 0xf);
    if (local_250.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_58);
    lVar10 = lVar10 + 1;
    if (lVar10 == 0xc) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(pmt_test1)
{
    static const unsigned int tx_counts[] = {1, 4, 7, 17, 56, 100, 127, 256, 312, 513, 1000, 4095};

    for (int i = 0; i < 12; i++) {
        unsigned int nTx = tx_counts[i];

        // build a block with some dummy transactions
        CBlock block;
        for (unsigned int j=0; j<nTx; j++) {
            CMutableTransaction tx;
            tx.nLockTime = j; // actual transaction data doesn't matter; just make the nLockTime's unique
            block.vtx.push_back(MakeTransactionRef(std::move(tx)));
        }

        // calculate actual merkle root and height
        uint256 merkleRoot1 = BlockMerkleRoot(block);
        std::vector<uint256> vTxid(nTx, uint256());
        for (unsigned int j=0; j<nTx; j++)
            vTxid[j] = block.vtx[j]->GetHash();
        int nHeight = 1, nTx_ = nTx;
        while (nTx_ > 1) {
            nTx_ = (nTx_+1)/2;
            nHeight++;
        }

        // check with random subsets with inclusion chances 1, 1/2, 1/4, ..., 1/128
        for (int att = 1; att < 15; att++) {
            // build random subset of txid's
            std::vector<bool> vMatch(nTx, false);
            std::vector<uint256> vMatchTxid1;
            for (unsigned int j=0; j<nTx; j++) {
                bool fInclude = m_rng.randbits(att / 2) == 0;
                vMatch[j] = fInclude;
                if (fInclude)
                    vMatchTxid1.push_back(vTxid[j]);
            }

            // build the partial merkle tree
            CPartialMerkleTree pmt1(vTxid, vMatch);

            // serialize
            DataStream ss{};
            ss << pmt1;

            // verify CPartialMerkleTree's size guarantees
            unsigned int n = std::min<unsigned int>(nTx, 1 + vMatchTxid1.size()*nHeight);
            BOOST_CHECK(ss.size() <= 10 + (258*n+7)/8);

            // deserialize into a tester copy
            CPartialMerkleTreeTester pmt2{m_rng};
            ss >> pmt2;

            // extract merkle root and matched txids from copy
            std::vector<uint256> vMatchTxid2;
            std::vector<unsigned int> vIndex;
            uint256 merkleRoot2 = pmt2.ExtractMatches(vMatchTxid2, vIndex);

            // check that it has the same merkle root as the original, and a valid one
            BOOST_CHECK(merkleRoot1 == merkleRoot2);
            BOOST_CHECK(!merkleRoot2.IsNull());

            // check that it contains the matched transactions (in the same order!)
            BOOST_CHECK(vMatchTxid1 == vMatchTxid2);

            // check that random bit flips break the authentication
            for (int j=0; j<4; j++) {
                CPartialMerkleTreeTester pmt3(pmt2);
                pmt3.Damage();
                std::vector<uint256> vMatchTxid3;
                uint256 merkleRoot3 = pmt3.ExtractMatches(vMatchTxid3, vIndex);
                BOOST_CHECK(merkleRoot3 != merkleRoot1);
            }
        }
    }
}